

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  RunProgramm *pRVar2;
  allocator local_41;
  string local_40;
  RunProgramm *local_20;
  RunProgramm *programm;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  programm = (RunProgramm *)argv;
  argv_local._0_4_ = argc;
  pRVar2 = (RunProgramm *)operator_new(0x30);
  pcVar1 = (char *)(programm->file_name)._M_string_length;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,pcVar1,&local_41);
  RunProgramm::RunProgramm(pRVar2,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_20 = pRVar2;
  RunProgramm::run(pRVar2);
  pRVar2 = local_20;
  if (local_20 != (RunProgramm *)0x0) {
    RunProgramm::~RunProgramm(local_20);
    operator_delete(pRVar2,0x30);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
  (void) argc;
  RunProgramm *programm = new RunProgramm(argv[FILE_NAME_ARG_INDEX]);
  programm->run();
  delete (programm);
  return 0;
}